

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O2

bool __thiscall Mustache::QtVariantContext::isFalse(QtVariantContext *this,QString *key)

{
  long lVar1;
  int iVar2;
  byte bVar3;
  double dVar4;
  QVariant value;
  QArrayDataPointer<QVariant> local_40;
  QVariant local_28;
  
  QtVariantContext::value(&local_28,this,key);
  iVar2 = ::QVariant::typeId(&local_28);
  switch(iVar2) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 7:
    bVar3 = ::QVariant::toBool();
    bVar3 = bVar3 ^ 1;
    break;
  case 8:
    ::QVariant::toMap();
    if (local_40.d == (Data *)0x0) {
      bVar3 = true;
    }
    else {
      lVar1._0_4_ = local_40.d[3].super_QArrayData.ref_;
      lVar1._4_4_ = local_40.d[3].super_QArrayData.flags;
      bVar3 = lVar1 == 0;
    }
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                *)&local_40);
    break;
  case 9:
  case 0xb:
    ::QVariant::toList();
    bVar3 = local_40.size == 0;
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_40);
    break;
  case 10:
switchD_00110c74_caseD_a:
    ::QVariant::toString();
    bVar3 = local_40.size == 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_40);
    break;
  default:
    if (iVar2 == 0x1c) {
      ::QVariant::toHash();
      if (local_40.d == (Data *)0x0) {
        bVar3 = true;
      }
      else {
        bVar3 = ((local_40.d)->super_QArrayData).alloc == 0;
      }
      QHash<QString,_QVariant>::~QHash((QHash<QString,_QVariant> *)&local_40);
      break;
    }
    if (iVar2 != 0x26) goto switchD_00110c74_caseD_a;
  case 6:
    dVar4 = (double)::QVariant::toDouble((bool *)&local_28);
    bVar3 = -(dVar4 == 0.0) & 1;
  }
  ::QVariant::~QVariant(&local_28);
  return (bool)bVar3;
}

Assistant:

bool QtVariantContext::isFalse(const QString& key) const
{
	QVariant value = this->value(key);
	switch (value.userType()) {
	case QMetaType::Double:
	case QMetaType::Float:
		// QVariant::toBool() rounds floats to the nearest int and then compares
		// against 0, which is not the falsiness behavior we want.
		return value.toDouble() == 0.;
	case QMetaType::QChar:
	case QMetaType::Int:
	case QMetaType::UInt:
	case QMetaType::LongLong:
	case QMetaType::ULongLong:
	case QMetaType::Bool:
		return !value.toBool();
	case QMetaType::QVariantList:
	case QMetaType::QStringList:
		return value.toList().isEmpty();
	case QMetaType::QVariantHash:
		return value.toHash().isEmpty();
	case QMetaType::QVariantMap:
		return value.toMap().isEmpty();
	default:
		return value.toString().isEmpty();
	}
}